

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inverse_discrete_cosine_transform.cc
# Opt level: O0

bool __thiscall
sptk::InverseDiscreteCosineTransform::Run
          (InverseDiscreteCosineTransform *this,
          vector<double,_std::allocator<double>_> *real_part_input,
          vector<double,_std::allocator<double>_> *imag_part_input,
          vector<double,_std::allocator<double>_> *real_part_output,
          vector<double,_std::allocator<double>_> *imag_part_output,Buffer *buffer)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> _Var4;
  const_iterator cVar5;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var6;
  reference pvVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  vector<double,_std::allocator<double>_> *this_00;
  long in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  long in_R8;
  long in_R9;
  double temp_imag_part;
  double temp_real_part;
  int i;
  double *fourier_transform_imag_part;
  double *fourier_transform_real_part;
  double *sine_table;
  double *cosine_table;
  int dft_length;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe78;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe88;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  int iVar10;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffea0;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffea8;
  bool local_1;
  
  bVar1 = FourierTransform::IsValid((FourierTransform *)0x106bbd);
  if ((((bVar1) &&
       (sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
       sVar3 == (long)*(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data._M_finish)) &&
      (sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDX),
      sVar3 == (long)*(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_finish)) &&
     (((in_RCX != 0 && (in_R8 != 0)) && (in_R9 != 0)))) {
    iVar2 = FourierTransform::GetLength((FourierTransform *)0x106c38);
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_R9 + 8));
    if (sVar3 != (long)iVar2) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffea0._M_current,
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    }
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_R9 + 0x20));
    if (sVar3 != (long)iVar2) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffea0._M_current,
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    }
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe78);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
    _Var6._M_current._4_4_ = in_stack_fffffffffffffe9c;
    _Var6._M_current._0_4_ = in_stack_fffffffffffffe98;
    std::
    copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,_Var6);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
    _Var4 = __gnu_cxx::
            __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
            operator+(in_stack_fffffffffffffe88._M_current,(difference_type)in_RDI);
    cVar5 = std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe78);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffe88._M_current,(difference_type)in_RDI);
    _Var6 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
            operator+(in_stack_fffffffffffffe88._M_current,(difference_type)in_RDI);
    std::
    transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::negate<double>>
              (_Var4._M_current,cVar5._M_current,_Var6._M_current);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffe88._M_current,(difference_type)in_RDI);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffe88._M_current,(difference_type)in_RDI);
    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe78);
    std::reverse<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_R9 + 8),
                        (long)*(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)
                                       ._M_impl.super__Vector_impl_data._M_finish);
    *pvVar7 = 0.0;
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe78);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
    __result._M_current._4_4_ = in_stack_fffffffffffffe9c;
    __result._M_current._0_4_ = in_stack_fffffffffffffe98;
    std::
    copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,__result);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
    _Var4 = __gnu_cxx::
            __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
            operator+(in_stack_fffffffffffffe88._M_current,(difference_type)in_RDI);
    cVar5 = std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe78);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffe88._M_current,(difference_type)in_RDI);
    _Var6 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
            operator+(in_stack_fffffffffffffe88._M_current,(difference_type)in_RDI);
    std::
    transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::negate<double>>
              (_Var4._M_current,cVar5._M_current,_Var6._M_current);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe78);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffe88._M_current,(difference_type)in_RDI);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffe88._M_current,(difference_type)in_RDI);
    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe78);
    std::reverse<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_R9 + 0x20),
                        (long)*(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)
                                       ._M_impl.super__Vector_impl_data._M_finish);
    *pvVar7 = 0.0;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,0);
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,0);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_R9 + 8),0);
    this_00 = (vector<double,_std::allocator<double>_> *)
              std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_R9 + 0x20),0);
    for (iVar10 = 0; iVar10 < iVar2; iVar10 = iVar10 + 1) {
      in_stack_fffffffffffffe90._M_current = (double *)pvVar7[iVar10];
      in_stack_fffffffffffffe88._M_current =
           (&(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start)[iVar10];
      pvVar7[iVar10] =
           (double)in_stack_fffffffffffffe90._M_current * pvVar8[iVar10] +
           -((double)in_stack_fffffffffffffe88._M_current * pvVar9[iVar10]);
      (&(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start)[iVar10] =
           (pointer)((double)in_stack_fffffffffffffe90._M_current * pvVar9[iVar10] +
                    (double)in_stack_fffffffffffffe88._M_current * pvVar8[iVar10]);
    }
    bVar1 = FourierTransform::Run
                      ((FourierTransform *)in_stack_fffffffffffffe90._M_current,
                       (vector<double,_std::allocator<double>_> *)
                       in_stack_fffffffffffffe88._M_current,in_RDI,in_stack_fffffffffffffe78,
                       (vector<double,_std::allocator<double>_> *)0x1071a0);
    if (bVar1) {
      std::vector<double,_std::allocator<double>_>::resize
                (this_00,CONCAT44(iVar10,in_stack_fffffffffffffe98));
      std::vector<double,_std::allocator<double>_>::resize
                (this_00,CONCAT44(iVar10,in_stack_fffffffffffffe98));
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool InverseDiscreteCosineTransform::Run(
    const std::vector<double>& real_part_input,
    const std::vector<double>& imag_part_input,
    std::vector<double>* real_part_output,
    std::vector<double>* imag_part_output,
    InverseDiscreteCosineTransform::Buffer* buffer) const {
  // Check inputs.
  if (!fourier_transform_.IsValid() ||
      real_part_input.size() != static_cast<std::size_t>(dct_length_) ||
      imag_part_input.size() != static_cast<std::size_t>(dct_length_) ||
      NULL == real_part_output || NULL == imag_part_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int dft_length(fourier_transform_.GetLength());
  if (buffer->fourier_transform_real_part_.size() !=
      static_cast<std::size_t>(dft_length)) {
    buffer->fourier_transform_real_part_.resize(dft_length);
  }
  if (buffer->fourier_transform_imag_part_.size() !=
      static_cast<std::size_t>(dft_length)) {
    buffer->fourier_transform_imag_part_.resize(dft_length);
  }

  // Prepare real part input.
  std::copy(real_part_input.begin(), real_part_input.end(),
            buffer->fourier_transform_real_part_.begin());
  std::transform(real_part_input.begin() + 1, real_part_input.end(),
                 buffer->fourier_transform_real_part_.begin() + dct_length_ + 1,
                 std::negate<double>());
  std::reverse(buffer->fourier_transform_real_part_.begin() + dct_length_ + 1,
               buffer->fourier_transform_real_part_.end());
  buffer->fourier_transform_real_part_[dct_length_] = 0.0;

  // Prepare imaginary part input.
  std::copy(imag_part_input.begin(), imag_part_input.end(),
            buffer->fourier_transform_imag_part_.begin());
  std::transform(imag_part_input.begin() + 1, imag_part_input.end(),
                 buffer->fourier_transform_imag_part_.begin() + dct_length_ + 1,
                 std::negate<double>());
  std::reverse(buffer->fourier_transform_imag_part_.begin() + dct_length_ + 1,
               buffer->fourier_transform_imag_part_.end());
  buffer->fourier_transform_imag_part_[dct_length_] = 0.0;

  const double* cosine_table(&(cosine_table_[0]));
  const double* sine_table(&(sine_table_[0]));
  double* fourier_transform_real_part(&buffer->fourier_transform_real_part_[0]);
  double* fourier_transform_imag_part(&buffer->fourier_transform_imag_part_[0]);

  for (int i(0); i < dft_length; ++i) {
    const double temp_real_part(fourier_transform_real_part[i]);
    const double temp_imag_part(fourier_transform_imag_part[i]);
    fourier_transform_real_part[i] =
        temp_real_part * cosine_table[i] - temp_imag_part * sine_table[i];
    fourier_transform_imag_part[i] =
        temp_real_part * sine_table[i] + temp_imag_part * cosine_table[i];
  }

  if (!fourier_transform_.Run(buffer->fourier_transform_real_part_,
                              buffer->fourier_transform_imag_part_,
                              real_part_output, imag_part_output)) {
    return false;
  }

  real_part_output->resize(dct_length_);
  imag_part_output->resize(dct_length_);

  return true;
}